

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tst_genericmodel.cpp
# Opt level: O0

int __thiscall tst_GenericModel::qt_metacall(tst_GenericModel *this,Call _c,int _id,void **_a)

{
  QMetaType local_30;
  void **local_28;
  void **_a_local;
  int _id_local;
  Call _c_local;
  tst_GenericModel *this_local;
  
  local_28 = _a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = this;
  _a_local._0_4_ = QObject::qt_metacall((Call)this,_c,(void **)(ulong)(uint)_id);
  this_local._4_4_ = (int)_a_local;
  if (-1 < (int)_a_local) {
    if (_a_local._4_4_ == InvokeMetaMethod) {
      if ((int)_a_local < 0x39) {
        qt_static_metacall(&this->super_QObject,InvokeMetaMethod,(int)_a_local,local_28);
      }
      _a_local._0_4_ = (int)_a_local + -0x39;
    }
    else if (_a_local._4_4_ == RegisterMethodArgumentMetaType) {
      if ((int)_a_local < 0x39) {
        memset(&local_30,0,8);
        QMetaType::QMetaType(&local_30);
        *(QMetaTypeInterface **)*local_28 = local_30.d_ptr;
      }
      _a_local._0_4_ = (int)_a_local + -0x39;
    }
    this_local._4_4_ = (int)_a_local;
  }
  return this_local._4_4_;
}

Assistant:

int tst_GenericModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 57)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 57;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 57)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 57;
    }
    return _id;
}